

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_serializer_boost_po.h
# Opt level: O2

void __thiscall
VW::config::options_serializer_boost_po::serialize<unsigned_long>
          (options_serializer_boost_po *this,
          typed_option<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *typed_option)

{
  ostream *poVar1;
  iterator __begin0;
  pointer puVar2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> vec;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  typed_option<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::value
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_48,typed_option);
  if (local_48._M_impl.super__Vector_impl_data._M_finish !=
      local_48._M_impl.super__Vector_impl_data._M_start) {
    for (puVar2 = local_48._M_impl.super__Vector_impl_data._M_start;
        puVar2 != local_48._M_impl.super__Vector_impl_data._M_finish; puVar2 = puVar2 + 1) {
      poVar1 = std::operator<<((ostream *)&this->field_0x18," --");
      std::operator<<(poVar1,(string *)&(typed_option->super_base_option).m_name);
      poVar1 = std::operator<<((ostream *)&this->field_0x18," ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    }
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

void serialize(typed_option<std::vector<T>> typed_option)
  {
    auto vec = typed_option.value();
    if (vec.size() > 0)
    {
      for (auto const& value : vec)
      {
        m_output_stream << " --" << typed_option.m_name;
        m_output_stream << " " << value;
      }
    }
  }